

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O1

Vec_Int_t * Abc_NtkAssignStarts(Abc_Ntk_t *pNtk,Vec_Ptr_t *vNodes,int *pnTotal)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  void *pvVar4;
  Vec_Int_t *pVVar5;
  int *__s;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  
  iVar1 = pNtk->nObjs;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar6;
  if (iVar6 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar6 << 2);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)iVar1 << 2);
  }
  iVar6 = vNodes->nSize;
  if ((long)iVar6 < 1) {
    iVar7 = 0;
  }
  else {
    ppvVar3 = vNodes->pArray;
    lVar8 = 0;
    iVar7 = 0;
    do {
      pvVar4 = ppvVar3[lVar8];
      iVar2 = *(int *)((long)pvVar4 + 0x40);
      if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __s[iVar2] = iVar7;
      iVar2 = *(int *)((long)pvVar4 + 0x1c);
      iVar9 = 1 << ((char)iVar2 - 6U & 0x1f);
      if (iVar2 < 7) {
        iVar9 = 1;
      }
      iVar7 = iVar7 + iVar9;
      lVar8 = lVar8 + 1;
    } while (iVar6 != lVar8);
  }
  *pnTotal = iVar7;
  return pVVar5;
}

Assistant:

Vec_Int_t * Abc_NtkAssignStarts( Abc_Ntk_t * pNtk, Vec_Ptr_t * vNodes, int * pnTotal )
{
    Abc_Obj_t * pObj; int i, Counter = 0;
    Vec_Int_t * vStarts = Vec_IntStart( Abc_NtkObjNum(pNtk) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Vec_IntWriteEntry( vStarts, pObj->iTemp, Counter );
        Counter += Abc_Truth6WordNum( Abc_ObjFaninNum(pObj) );
    }
    *pnTotal = Counter;
    return vStarts;
}